

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *abs_path,
          SkelAnimation *skelAnim,Animation *anim_out)

{
  pointer *ppAVar1;
  storage_t<std::array<float,_3UL>_> *psVar2;
  pointer *ppAVar3;
  pointer *ppAVar4;
  storage_t<std::array<float,_4UL>_> *psVar5;
  Stage *pSVar6;
  pointer paVar7;
  undefined8 uVar8;
  pointer pcVar9;
  iterator iVar10;
  iterator __position;
  _Base_ptr p_Var11;
  iterator __position_00;
  void *pvVar12;
  pointer pTVar13;
  Animation *pAVar14;
  bool bVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  pointer paVar19;
  ostream *poVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  undefined8 *puVar23;
  char *pcVar24;
  iterator __begin3;
  string *psVar25;
  optional<tinyusdz::Path::PathType> __k;
  pointer pSVar26;
  pointer in;
  uint64_t uVar27;
  char *pcVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  Path *in_R9;
  long lVar30;
  ulong uVar31;
  iterator __end3;
  pointer pcVar32;
  pointer pSVar33;
  vector<float,_std::allocator<float>_> ws;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translation;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> _rotation;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  rotations;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  translations;
  Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  scales;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapes;
  StringAndIdMap jointIdMap;
  ostringstream ss_e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  channelMap;
  Path *in_stack_fffffffffffffc08;
  undefined1 local_3e8 [4];
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  RenderSceneConverter *local_3c8;
  pointer local_3c0;
  string local_3b8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_398;
  SkelAnimation *local_380;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_378;
  string local_358;
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  undefined1 local_2f8 [10];
  undefined2 uStack_2ee;
  undefined4 uStack_2ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [32];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_278;
  Animation *local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [17];
  undefined7 uStack_227;
  _Rb_tree_node_base _Stack_220;
  uint64_t local_200;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [6];
  ios_base local_178 [264];
  RenderSceneConverterEnv *local_70;
  unsigned_long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  local_60;
  
  local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8 = this;
  local_260 = anim_out;
  if (((((skelAnim->joints)._attrib.has_value_ != false) ||
       ((skelAnim->joints)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (skelAnim->joints)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) || ((skelAnim->joints)._value_empty != false)) ||
     ((skelAnim->joints)._blocked == true)) {
    pSVar6 = env->stage;
    local_1e8._0_8_ = local_1d8;
    local_70 = env;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"joints","");
    local_3c0 = (pointer)&local_3c8->_err;
    bVar15 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                       (pSVar6,&skelAnim->joints,(string *)local_1e8,&local_398,(string *)local_3c0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    if (bVar15) {
      if ((((((skelAnim->rotations)._attrib.has_value_ != false) ||
            ((skelAnim->rotations)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (skelAnim->rotations)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start)) ||
           (((skelAnim->rotations)._value_empty != false || ((skelAnim->rotations)._blocked == true)
            ))) && ((((skelAnim->translations)._attrib.has_value_ != false ||
                     ((skelAnim->translations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (skelAnim->translations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_start)) ||
                    (((skelAnim->translations)._value_empty != false ||
                     ((skelAnim->translations)._blocked == true)))))) &&
         ((((env = local_70, (skelAnim->scales)._attrib.has_value_ != false ||
            ((skelAnim->scales)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (skelAnim->scales)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start)) || ((skelAnim->scales)._value_empty != false)) ||
          ((skelAnim->scales)._blocked != false)))) goto LAB_0034ac1a;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1531);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      local_2f8._0_8_ = &local_2e8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,
                 "`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}"
                 ,"");
      if ((((skelAnim->translations)._attrib.has_value_ == false) &&
          ((skelAnim->translations)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (skelAnim->translations)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) &&
         (((skelAnim->translations)._value_empty == false &&
          ((skelAnim->translations)._blocked != true)))) {
        local_338._0_8_ = "no";
      }
      else {
        local_338._0_8_ = "yes";
      }
      if ((((skelAnim->rotations)._attrib.has_value_ == false) &&
          ((skelAnim->rotations)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (skelAnim->rotations)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) &&
         (((skelAnim->rotations)._value_empty == false && ((skelAnim->rotations)._blocked != true)))
         ) {
        local_2b8._0_8_ = "no";
      }
      else {
        local_2b8._0_8_ = "yes";
      }
      if (((((skelAnim->scales)._attrib.has_value_ == false) &&
           ((skelAnim->scales)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (skelAnim->scales)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start)) && ((skelAnim->scales)._value_empty == false)) &&
         ((skelAnim->scales)._blocked != true)) {
        local_60._M_impl._0_8_ = "no";
      }
      else {
        local_60._M_impl._0_8_ = "yes";
      }
      fmt::format<tinyusdz::Path,char_const*,char_const*,char_const*>
                ((string *)local_258,(fmt *)local_2f8,(string *)abs_path,(Path *)local_338,
                 (char **)local_2b8,(char **)&local_60,(char **)in_stack_fffffffffffffc08);
      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(char *)local_258._0_8_,
                           CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &local_2e8) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                                 local_2e8._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)local_3c0,local_258._0_8_);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) goto LAB_0034b6cc;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1528);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      local_2f8._0_8_ = &local_2e8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,"Failed to evaluate `joints` in SkelAnimation Prim : {}","");
      fmt::format<tinyusdz::Path>((string *)local_258,(string *)local_2f8,abs_path);
      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(char *)local_258._0_8_,
                           CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &local_2e8) {
        operator_delete((void *)local_2f8._0_8_,
                        CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                                 local_2e8._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)local_3c0,local_258._0_8_);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
LAB_0034b6cc:
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    ::std::ios_base::~ios_base(local_178);
    bVar15 = false;
    goto LAB_0034c7bd;
  }
LAB_0034ac1a:
  local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((skelAnim->blendShapes)._attrib.has_value_ == false) &&
      ((skelAnim->blendShapes)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (skelAnim->blendShapes)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) &&
     (((skelAnim->blendShapes)._value_empty == false && ((skelAnim->blendShapes)._blocked != true)))
     ) {
LAB_0034ad0c:
    pTVar13 = local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_0034c0cc:
      pTVar13 = local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_2d8._0_8_ = local_2f8 + 8;
        local_2f8._8_2_ = _S_red;
        uStack_2ee = _S_red >> 0x10;
        local_2e8._M_allocated_capacity._0_2_ = 0;
        local_2e8._M_allocated_capacity._2_6_ = 0;
        local_2e8._M_local_buf[8] = (char)local_2d8._0_8_;
        local_2e8._M_local_buf[9] = (char)((ulong)local_2d8._0_8_ >> 8);
        local_2e8._10_6_ = (undefined6)((ulong)local_2d8._0_8_ >> 0x10);
        local_2d8[8] = 0;
        local_2d8._9_7_ = 0;
        if (((((skelAnim->blendShapeWeights)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (skelAnim->blendShapeWeights)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start) &&
             ((skelAnim->blendShapeWeights)._attrib.has_value_ == false)) &&
            ((skelAnim->blendShapeWeights)._blocked == false)) &&
           ((skelAnim->blendShapeWeights)._value_empty == true)) {
          __k = (optional<tinyusdz::Path::PathType>)
                local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar21 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                    *)local_2f8,(key_type *)__k);
            if ((pmVar21->static_value).has_value_ == false) {
              (pmVar21->static_value).has_value_ = true;
            }
            (pmVar21->static_value).contained = (storage_t<float>)0x3f800000;
            __k = (optional<tinyusdz::Path::PathType>)((long)__k + 0x20);
          } while (__k != (optional<tinyusdz::Path::PathType>)pTVar13);
        }
        else {
          local_238[0x10] = 0;
          uStack_227 = 0;
          _Stack_220._M_color = _Stack_220._M_color & 0xffffff00;
          local_238._0_8_ = (pointer)0x0;
          local_238[8] = 0;
          local_238._9_7_ = 0;
          local_258._0_8_ = (char *)0x0;
          local_258._8_2_ = _S_red;
          local_258._10_2_ = _S_red >> 0x10;
          local_258._12_4_ = 0;
          local_258._16_2_ = 0;
          local_258._18_6_ = 0;
          local_258[0x18] = '\0';
          local_258[0x19] = '\0';
          bVar15 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                   ::get_value(&skelAnim->blendShapeWeights,
                               (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_258)
          ;
          local_380 = skelAnim;
          if (bVar15) {
            if ((bool)(undefined1)_Stack_220._M_color == true) {
              TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::update
                        ((TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *)local_238)
              ;
            }
            pSVar33 = (pointer)CONCAT71(local_238._9_7_,local_238[8]);
            if (pSVar33 != (pointer)local_238._0_8_) {
              if ((bool)(undefined1)_Stack_220._M_color == true) {
                TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::update
                          ((TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *)
                           local_238);
                pSVar33 = (pointer)CONCAT71(local_238._9_7_,local_238[8]);
              }
              if ((pointer)local_238._0_8_ != pSVar33) {
                in = (pointer)local_238._0_8_;
                do {
                  if (in->blocked == false) {
                    p_Var22 = (_Base_ptr)
                              (in->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    p_Var11 = (_Base_ptr)
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish)->_M_allocated_capacity
                    ;
                    if ((long)p_Var11 - (long)p_Var22 >> 2 !=
                        (long)local_278.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 5) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"():",3);
                      poVar20 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1e8,0x1659);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                      local_2b8._0_8_ = local_2b8 + 0x10;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2b8,
                                 "Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}"
                                 ,"");
                      lVar30 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->
                               _M_allocated_capacity -
                               (long)(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                      local_3e8 = SUB84(lVar30 >> 2,0);
                      fStack_3e4 = (float)(lVar30 >> 0x22);
                      local_3b8._M_dataplus._M_p =
                           (pointer)((long)local_278.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_278.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
                      fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                                ((string *)local_338,(fmt *)local_2b8,(string *)in,
                                 (double *)local_3e8,(unsigned_long *)&local_3b8,
                                 (unsigned_long *)abs_path,in_stack_fffffffffffffc08);
                      goto LAB_0034cc58;
                    }
                    if (p_Var11 != p_Var22) {
                      lVar30 = 0;
                      uVar31 = 0;
                      do {
                        local_1e8._4_4_ = (&p_Var22->_M_color)[uVar31];
                        local_1e8._0_4_ = (float)(double)((_Alloc_hider *)&in->t)->_M_p;
                        pmVar21 = ::std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                                *)local_2f8,
                                               (key_type *)
                                               ((long)local_278.
                                                                                                            
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar30
                                               ));
                        __position_00._M_current =
                             (pmVar21->samples).
                             super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (__position_00._M_current ==
                            (pmVar21->samples).
                            super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          ::std::
                          vector<tinyusdz::tydra::AnimationSample<float>,std::allocator<tinyusdz::tydra::AnimationSample<float>>>
                          ::_M_realloc_insert<tinyusdz::tydra::AnimationSample<float>const&>
                                    ((vector<tinyusdz::tydra::AnimationSample<float>,std::allocator<tinyusdz::tydra::AnimationSample<float>>>
                                      *)&pmVar21->samples,__position_00,
                                     (AnimationSample<float> *)local_1e8);
                        }
                        else {
                          (__position_00._M_current)->t = (float)local_1e8._0_4_;
                          (__position_00._M_current)->value = (float)local_1e8._4_4_;
                          ppAVar1 = &(pmVar21->samples).
                                     super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppAVar1 = *ppAVar1 + 1;
                        }
                        uVar31 = uVar31 + 1;
                        p_Var22 = (_Base_ptr)
                                  (in->value).super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        lVar30 = lVar30 + 0x20;
                      } while (uVar31 < (ulong)((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(in->value).
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity - (long)p_Var22) >> 2));
                    }
                  }
                  in = in + 1;
                } while (in != pSVar33);
              }
            }
            if (local_258[0x18] != '\x01') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1678);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_2b8._0_8_ = local_2b8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,
                         "Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                         ,"");
              fmt::format<tinyusdz::Path>((string *)local_338,(string *)local_2b8,abs_path);
LAB_0034cc58:
              poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,(char *)local_338._0_8_,
                                   CONCAT62(local_338._10_6_,local_338._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                operator_delete((void *)local_338._0_8_,
                                CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
              }
              if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) goto LAB_0034c5f5;
              goto LAB_0034c605;
            }
            local_3e8 = (undefined1  [4])0x0;
            fStack_3e4 = 0.0;
            fStack_3e0 = 0.0;
            fStack_3dc = 0.0;
            local_3d8._M_allocated_capacity = 0;
            if (local_258[0x19] == '\x01') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x166c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,
                         "Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                         ,"");
              fmt::format<tinyusdz::Path>((string *)local_338,(string *)local_2b8,abs_path);
              poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,(char *)local_338._0_8_,
                                   CONCAT62(local_338._10_6_,local_338._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                operator_delete((void *)local_338._0_8_,
                                CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
              }
              if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_,
                                CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                         local_2a8._M_allocated_capacity._0_2_) + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,local_338._0_8_);
              if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
LAB_0034c47a:
                operator_delete((void *)local_338._0_8_,
                                CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
              }
LAB_0034c48a:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_178);
              bVar15 = false;
            }
            else {
              ::std::vector<float,_std::allocator<float>_>::operator=
                        ((vector<float,_std::allocator<float>_> *)local_3e8,
                         (vector<float,_std::allocator<float>_> *)local_258);
              if (CONCAT44(fStack_3dc,fStack_3e0) - CONCAT44(fStack_3e4,local_3e8) >> 2 !=
                  (long)local_278.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_278.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                           ,0x5b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1670);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,
                           "blendShapeWeights.size {} must be equal to blendShapes.size {} : {}","")
                ;
                local_3b8._M_dataplus._M_p =
                     (pointer)(CONCAT44(fStack_3dc,fStack_3e0) - CONCAT44(fStack_3e4,local_3e8) >> 2
                              );
                local_378.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)local_278.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_278.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
                fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                          ((string *)local_338,(fmt *)local_2b8,&local_3b8,
                           (unsigned_long *)&local_378,(unsigned_long *)abs_path,in_R9);
                poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e8,(char *)local_338._0_8_,
                                     CONCAT62(local_338._10_6_,local_338._8_2_));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                  operator_delete((void *)local_338._0_8_,
                                  CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
                }
                if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                  operator_delete((void *)local_2b8._0_8_,
                                  CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                           local_2a8._M_allocated_capacity._0_2_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,local_338._0_8_);
                if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) goto LAB_0034c47a;
                goto LAB_0034c48a;
              }
              bVar15 = true;
              if (local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_278.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                lVar30 = 0;
                uVar31 = 0;
                do {
                  local_3c8 = (RenderSceneConverter *)
                              CONCAT44(local_3c8._4_4_,
                                       *(undefined4 *)(CONCAT44(fStack_3e4,local_3e8) + uVar31 * 4))
                  ;
                  pmVar21 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                          *)local_2f8,
                                         (key_type *)
                                         ((long)local_278.
                                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar30))
                  ;
                  if ((pmVar21->static_value).has_value_ == false) {
                    (pmVar21->static_value).has_value_ = true;
                  }
                  (pmVar21->static_value).contained = local_3c8._0_4_;
                  uVar31 = uVar31 + 1;
                  lVar30 = lVar30 + 0x20;
                } while (uVar31 < (ulong)((long)local_278.
                                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
            }
            pvVar12 = (void *)CONCAT44(fStack_3e4,local_3e8);
            if (pvVar12 != (void *)0x0) {
              operator_delete(pvVar12,local_3d8._M_allocated_capacity - (long)pvVar12);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
            poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x164f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
            local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,
                       "Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                       ,"");
            fmt::format<tinyusdz::Path>((string *)local_338,(string *)local_2b8,abs_path);
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,(char *)local_338._0_8_,
                                 CONCAT62(local_338._10_6_,local_338._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
              operator_delete((void *)local_338._0_8_,
                              CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
            }
            if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
LAB_0034c5f5:
              operator_delete((void *)local_2b8._0_8_,
                              CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                       local_2a8._M_allocated_capacity._0_2_) + 1);
            }
LAB_0034c605:
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,local_338._0_8_);
            if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
              operator_delete((void *)local_338._0_8_,
                              CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
            bVar15 = false;
          }
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                     *)local_238);
          if ((char *)local_258._0_8_ != (char *)0x0) {
            operator_delete((void *)local_258._0_8_,
                            CONCAT62(local_258._18_6_,local_258._16_2_) - local_258._0_8_);
          }
          skelAnim = local_380;
          if (!bVar15) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                        *)local_2f8,
                       (_Link_type)
                       CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                                local_2e8._M_allocated_capacity._0_2_));
            goto LAB_0034c79d;
          }
        }
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::operator=(&local_260->blendshape_weights_map,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                     *)local_2f8);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                    *)local_2f8,
                   (_Link_type)
                   CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                            local_2e8._M_allocated_capacity._0_2_));
      }
      Path::full_path_name_abi_cxx11_((string *)local_1e8,abs_path);
      ::std::__cxx11::string::operator=((string *)&local_260->abs_path,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
      }
      pAVar14 = local_260;
      ::std::__cxx11::string::_M_assign((string *)local_260);
      nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
                ((value_type *)local_1e8,
                 (optional<std::__cxx11::string> *)&(skelAnim->meta).displayName,
                 (char (*) [1])0x5f3bf3);
      ::std::__cxx11::string::operator=((string *)&pAVar14->display_name,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
      }
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
      ::operator=(&local_260->channels_map,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                   *)&local_60);
      bVar15 = true;
    }
    else {
      local_238._0_8_ = local_258 + 8;
      local_258._8_2_ = _S_red;
      local_258._10_2_ = _S_red >> 0x10;
      local_258._16_2_ = 0;
      local_258._18_6_ = 0;
      local_258[0x18] = (undefined1)local_238._0_8_;
      local_258[0x19] = (undefined1)((ulong)local_238._0_8_ >> 8);
      local_258._26_6_ = (undefined6)((ulong)local_238._0_8_ >> 0x10);
      local_238[8] = 0;
      local_238._9_7_ = 0;
      _Stack_220._M_left = &_Stack_220;
      _Stack_220._M_color = _S_red;
      _Stack_220._M_parent = (_Base_ptr)0x0;
      local_200 = 0;
      psVar25 = &(local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start)->str_;
      _Stack_220._M_right = _Stack_220._M_left;
      do {
        uVar27 = CONCAT71(local_238._9_7_,local_238[8]);
        if (uVar27 != local_200) {
          uVar27 = 0;
        }
        StringAndIdMap::add((StringAndIdMap *)local_258,psVar25,uVar27);
        psVar25 = psVar25 + 1;
      } while (psVar25 != &pTVar13->str_);
      local_2d8[0x10] = '\0';
      local_2d8._17_8_ = 0;
      local_2d8._0_8_ = (pointer)0x0;
      local_2d8[8] = 0;
      local_2d8._9_7_ = 0;
      local_2f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_2f8._8_2_ = _S_red;
      uStack_2ee = _S_red >> 0x10;
      uStack_2ec = 0;
      local_2e8._M_allocated_capacity._0_2_ = 0;
      local_2e8._M_allocated_capacity._2_6_ = 0;
      local_2e8._M_local_buf[8] = false;
      local_2e8._M_local_buf[9] = false;
      bVar15 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
               ::get_value(&skelAnim->translations,
                           (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                            *)local_2f8);
      if (bVar15) {
        local_318[0x10] = '\0';
        local_318._17_8_ = 0;
        local_318._0_8_ = (pointer)0x0;
        local_318[8] = 0;
        local_318._9_7_ = 0;
        local_338._0_8_ = (pointer)0x0;
        local_338._8_2_ = 0;
        local_338._10_6_ = 0;
        local_338._16_2_ = 0;
        local_338._18_6_ = 0;
        local_338[0x18] = false;
        local_338[0x19] = false;
        bVar15 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                 ::get_value(&skelAnim->rotations,
                             (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                              *)local_338);
        if (!bVar15) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
          poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1559);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
          _local_3e8 = (pointer)&local_3d8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3e8,
                     "Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,"");
          fmt::format<tinyusdz::Path>((string *)local_2b8,(string *)local_3e8,abs_path);
          poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,(char *)local_2b8._0_8_,
                               CONCAT62(local_2b8._10_6_,local_2b8._8_2_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,
                            CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                     local_2a8._M_allocated_capacity._0_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_local_3e8 != &local_3d8) {
            operator_delete(_local_3e8,local_3d8._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,local_2b8._0_8_);
          if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,
                            CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                     local_2a8._M_allocated_capacity._0_2_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          ::std::ios_base::~ios_base(local_178);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                     *)local_318);
          if ((pointer)local_338._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_338._0_8_,
                            CONCAT62(local_338._18_6_,local_338._16_2_) - local_338._0_8_);
          }
          goto LAB_0034be4d;
        }
        local_298[0x10] = '\0';
        local_298._17_8_ = 0;
        local_298._0_8_ = (pointer)0x0;
        local_298[8] = 0;
        local_298._9_7_ = 0;
        local_2b8._0_8_ = (pointer)0x0;
        local_2b8._8_2_ = 0;
        local_2b8._10_6_ = 0;
        local_2a8._M_allocated_capacity._0_2_ = 0;
        local_2a8._M_allocated_capacity._2_6_ = 0;
        local_2a8._M_local_buf[8] = false;
        local_2a8._M_local_buf[9] = false;
        bVar15 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                 ::get_value(&skelAnim->scales,
                             (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                              *)local_2b8);
        if (bVar15) {
          local_380 = skelAnim;
          if ((bool)local_2d8[0x18] == true) {
            TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      *)local_2d8);
          }
          local_3c0 = (pointer)CONCAT71(local_2d8._9_7_,local_2d8[8]);
          if (local_3c0 != (pointer)local_2d8._0_8_) {
            if ((bool)local_2d8[0x18] == true) {
              TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                        *)local_2d8);
              local_3c0 = (pointer)CONCAT71(local_2d8._9_7_,local_2d8[8]);
            }
            if ((pointer)local_2d8._0_8_ == local_3c0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1571);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,
                         "`translations` timeSamples in SkelAnimation is empty : {}","");
              fmt::format<tinyusdz::Path>((string *)local_3e8,&local_3b8,abs_path);
              poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8),
                                   CONCAT44(fStack_3dc,fStack_3e0));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(fStack_3e4,local_3e8),
                                local_3d8._M_allocated_capacity + 1);
              }
              skelAnim = local_380;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) goto LAB_0034bfb2;
              goto LAB_0034bfbf;
            }
            if ((bool)local_2d8[0x18] == true) {
              TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                        *)local_2d8);
              local_3c0 = (pointer)CONCAT71(local_2d8._9_7_,local_2d8[8]);
            }
            if ((pointer)local_2d8._0_8_ != local_3c0) {
              pSVar26 = (pointer)local_2d8._0_8_;
              do {
                if (pSVar26->blocked == false) {
                  paVar19 = (pSVar26->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar7 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)&(pSVar26->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->
                                    _M_allocated_capacity;
                  if (((long)paVar7 - (long)paVar19 >> 2) * -0x5555555555555555 -
                      ((long)local_398.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_398.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"():",3);
                    poVar20 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1e8,0x1578);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b8,
                               "Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}"
                               ,"");
                    local_378.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)&(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->
                                           _M_allocated_capacity -
                                          (long)(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                  -0x5555555555555555);
                    local_358._M_dataplus._M_p =
                         (pointer)((long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)local_3e8,(fmt *)&local_3b8,(string *)pSVar26,
                               (double *)&local_378,(unsigned_long *)&local_358,
                               (unsigned_long *)abs_path,in_stack_fffffffffffffc08);
                    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8)
                                         ,CONCAT44(fStack_3dc,fStack_3e0));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(fStack_3e4,local_3e8),
                                      local_3d8._M_allocated_capacity + 1);
                    }
                    skelAnim = local_380;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_3c8->_err,CONCAT44(fStack_3e4,local_3e8));
                    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8);
                    if (paVar29 == &local_3d8) goto LAB_0034c001;
                    goto LAB_0034bff4;
                  }
                  if (paVar7 != paVar19) {
                    lVar30 = 0;
                    pcVar32 = (pointer)0x0;
                    do {
                      local_3e8 = (undefined1  [4])
                                  (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p;
                      fStack_3dc = *(float *)((long)paVar19->_M_elems + lVar30 + 8);
                      uVar8 = *(undefined8 *)((long)paVar19->_M_elems + lVar30);
                      fStack_3e4 = (float)uVar8;
                      fStack_3e0 = (float)((ulong)uVar8 >> 0x20);
                      local_3b8._M_dataplus._M_p = pcVar32;
                      pmVar16 = ::std::
                                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_258,(key_type *)&local_3b8);
                      pcVar9 = (pmVar16->_M_dataplus)._M_p;
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1e8,pcVar9,pcVar9 + pmVar16->_M_string_length);
                      pmVar17 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                              *)&local_60,(key_type *)local_1e8);
                      local_3b8._M_dataplus._M_p._0_4_ = 1;
                      pmVar18 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar17,(key_type *)&local_3b8);
                      iVar10._M_current =
                           (pmVar18->translations).samples.
                           super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((pmVar18->translations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == iVar10._M_current) {
                        pmVar18->type = Translation;
                      }
                      if (iVar10._M_current ==
                          (pmVar18->translations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                        ::
                        _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>const&>
                                  ((vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                                    *)&(pmVar18->translations).samples,iVar10,
                                   (AnimationSample<std::array<float,_3UL>_> *)local_3e8);
                      }
                      else {
                        (iVar10._M_current)->t = (float)local_3e8;
                        ((iVar10._M_current)->value)._M_elems[0] = fStack_3e4;
                        ((iVar10._M_current)->value)._M_elems[1] = fStack_3e0;
                        ((iVar10._M_current)->value)._M_elems[2] = fStack_3dc;
                        ppAVar3 = &(pmVar18->translations).samples.
                                   super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar3 = *ppAVar3 + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,
                                        local_1d8[0]._M_allocated_capacity + 1);
                      }
                      pcVar32 = pcVar32 + 1;
                      paVar19 = (pSVar26->value).
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar30 = lVar30 + 0xc;
                    } while (pcVar32 < (pointer)(((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity - (long)paVar19) >> 2) *
                                                -0x5555555555555555));
                  }
                }
                pSVar26 = pSVar26 + 1;
              } while (pSVar26 != local_3c0);
            }
          }
          if ((bool)local_318[0x18] == true) {
            TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::update((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                      *)local_318);
          }
          local_3c0 = (pointer)CONCAT71(local_318._9_7_,local_318[8]);
          if (local_3c0 != (pointer)local_318._0_8_) {
            if ((bool)local_318[0x18] == true) {
              TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::update((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        *)local_318);
              local_3c0 = (pointer)CONCAT71(local_318._9_7_,local_318[8]);
            }
            if ((pointer)local_318._0_8_ != local_3c0) {
              pSVar26 = (pointer)local_318._0_8_;
              do {
                if (pSVar26->blocked == false) {
                  paVar19 = (pSVar26->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar7 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)&(pSVar26->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->
                                    _M_allocated_capacity;
                  if ((long)paVar7 - (long)paVar19 >> 4 !=
                      (long)local_398.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_398.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"():",3);
                    poVar20 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1e8,0x1592);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b8,
                               "Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}"
                               ,"");
                    local_378.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                            *)&(pSVar26->value).
                                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                          _M_allocated_capacity -
                                         (long)(pSVar26->value).
                                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
                    local_358._M_dataplus._M_p =
                         (pointer)((long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)local_3e8,(fmt *)&local_3b8,(string *)pSVar26,
                               (double *)&local_378,(unsigned_long *)&local_358,
                               (unsigned_long *)abs_path,in_stack_fffffffffffffc08);
                    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8)
                                         ,CONCAT44(fStack_3dc,fStack_3e0));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(fStack_3e4,local_3e8),
                                      local_3d8._M_allocated_capacity + 1);
                    }
                    skelAnim = local_380;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p == &local_3b8.field_2) goto LAB_0034bfbf;
                    goto LAB_0034bfb2;
                  }
                  if (paVar7 != paVar19) {
                    lVar30 = 0xc;
                    pcVar32 = (pointer)0x0;
                    do {
                      local_3e8 = (undefined1  [4])
                                  (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p;
                      fStack_3e4 = *(float *)((long)paVar19[-1]._M_elems + lVar30);
                      fStack_3e0 = *(float *)((long)paVar19->_M_elems + lVar30 + -8);
                      fStack_3dc = *(float *)((long)paVar19->_M_elems + lVar30 + -4);
                      local_3d8._M_allocated_capacity._0_4_ =
                           *(undefined4 *)((long)paVar19->_M_elems + lVar30);
                      local_3b8._M_dataplus._M_p = pcVar32;
                      pmVar16 = ::std::
                                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_258,(key_type *)&local_3b8);
                      pcVar9 = (pmVar16->_M_dataplus)._M_p;
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1e8,pcVar9,pcVar9 + pmVar16->_M_string_length);
                      pmVar17 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                              *)&local_60,(key_type *)local_1e8);
                      local_3b8._M_dataplus._M_p._0_4_ = 2;
                      pmVar18 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar17,(key_type *)&local_3b8);
                      __position._M_current =
                           (pmVar18->rotations).samples.
                           super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((pmVar18->rotations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
                        pmVar18->type = Rotation;
                      }
                      if (__position._M_current ==
                          (pmVar18->rotations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>>>
                        ::
                        _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>const&>
                                  ((vector<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>>>
                                    *)&(pmVar18->rotations).samples,__position,
                                   (AnimationSample<std::array<float,_4UL>_> *)local_3e8);
                      }
                      else {
                        ((__position._M_current)->value)._M_elems[3] =
                             (float)local_3d8._M_allocated_capacity._0_4_;
                        (__position._M_current)->t = (float)local_3e8;
                        ((__position._M_current)->value)._M_elems[0] = fStack_3e4;
                        ((__position._M_current)->value)._M_elems[1] = fStack_3e0;
                        ((__position._M_current)->value)._M_elems[2] = fStack_3dc;
                        ppAVar4 = &(pmVar18->rotations).samples.
                                   super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar4 = *ppAVar4 + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,
                                        local_1d8[0]._M_allocated_capacity + 1);
                      }
                      pcVar32 = pcVar32 + 1;
                      paVar19 = (pSVar26->value).
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar30 = lVar30 + 0x10;
                    } while (pcVar32 < (pointer)((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity - (long)paVar19) >> 4));
                  }
                }
                pSVar26 = pSVar26 + 1;
              } while (pSVar26 != local_3c0);
            }
          }
          if ((bool)local_298[0x18] == true) {
            TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::update((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                      *)local_298);
          }
          local_3c0 = (pointer)CONCAT71(local_298._9_7_,local_298[8]);
          if (local_3c0 != (pointer)local_298._0_8_) {
            if ((bool)local_298[0x18] == true) {
              TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
              ::update((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        *)local_298);
              local_3c0 = (pointer)CONCAT71(local_298._9_7_,local_298[8]);
            }
            if ((pointer)local_298._0_8_ != local_3c0) {
              pSVar26 = (pointer)local_298._0_8_;
              do {
                if (pSVar26->blocked == false) {
                  paVar19 = (pSVar26->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar7 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)&(pSVar26->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->
                                    _M_allocated_capacity;
                  if (((long)paVar7 - (long)paVar19 >> 1) * -0x5555555555555555 -
                      ((long)local_398.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_398.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"():",3);
                    poVar20 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1e8,0x15ae);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b8,
                               "Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}"
                               ,"");
                    local_378.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)&(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->
                                           _M_allocated_capacity -
                                          (long)(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 1) *
                                  -0x5555555555555555);
                    local_358._M_dataplus._M_p =
                         (pointer)((long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_398.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)local_3e8,(fmt *)&local_3b8,(string *)pSVar26,
                               (double *)&local_378,(unsigned_long *)&local_358,
                               (unsigned_long *)abs_path,in_stack_fffffffffffffc08);
                    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8)
                                         ,CONCAT44(fStack_3dc,fStack_3e0));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(fStack_3e4,local_3e8),
                                      local_3d8._M_allocated_capacity + 1);
                    }
                    skelAnim = local_380;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_3c8->_err,CONCAT44(fStack_3e4,local_3e8));
                    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8);
                    if (paVar29 == &local_3d8) goto LAB_0034c001;
                    goto LAB_0034bff4;
                  }
                  if (paVar7 != paVar19) {
                    lVar30 = 0;
                    pcVar32 = (pointer)0x0;
                    do {
                      local_3e8 = (undefined1  [4])
                                  (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p;
                      fStack_3e4 = tinyusdz::value::half_to_float
                                             ((half)*(uint16_t *)((long)paVar19->_M_elems + lVar30))
                      ;
                      fStack_3e0 = tinyusdz::value::half_to_float
                                             ((half)*(uint16_t *)
                                                     ((long)((pSVar26->value).
                                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar30 + 2));
                      fStack_3dc = tinyusdz::value::half_to_float
                                             ((half)*(uint16_t *)
                                                     ((long)((pSVar26->value).
                                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar30 + 4));
                      local_3b8._M_dataplus._M_p = pcVar32;
                      pmVar16 = ::std::
                                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_258,(key_type *)&local_3b8);
                      pcVar9 = (pmVar16->_M_dataplus)._M_p;
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1e8,pcVar9,pcVar9 + pmVar16->_M_string_length);
                      pmVar17 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                              *)&local_60,(key_type *)local_1e8);
                      local_3b8._M_dataplus._M_p._0_4_ = 3;
                      pmVar18 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar17,(key_type *)&local_3b8);
                      iVar10._M_current =
                           (pmVar18->scales).samples.
                           super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((pmVar18->scales).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == iVar10._M_current) {
                        pmVar18->type = Scale;
                      }
                      if (iVar10._M_current ==
                          (pmVar18->scales).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                        ::
                        _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>const&>
                                  ((vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                                    *)&(pmVar18->scales).samples,iVar10,
                                   (AnimationSample<std::array<float,_3UL>_> *)local_3e8);
                      }
                      else {
                        (iVar10._M_current)->t = (float)local_3e8;
                        ((iVar10._M_current)->value)._M_elems[0] = fStack_3e4;
                        ((iVar10._M_current)->value)._M_elems[1] = fStack_3e0;
                        ((iVar10._M_current)->value)._M_elems[2] = fStack_3dc;
                        ppAVar3 = &(pmVar18->scales).samples.
                                   super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar3 = *ppAVar3 + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,
                                        local_1d8[0]._M_allocated_capacity + 1);
                      }
                      pcVar32 = pcVar32 + 1;
                      paVar19 = (pSVar26->value).
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar30 = lVar30 + 6;
                    } while (pcVar32 < (pointer)(((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity - (long)paVar19) >> 1) *
                                                -0x5555555555555555));
                  }
                }
                pSVar26 = pSVar26 + 1;
              } while (pSVar26 != local_3c0);
            }
          }
          skelAnim = local_380;
          if ((bool)local_2e8._M_local_buf[8] == true) {
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((bool)local_2e8._M_local_buf[9] == true) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15cd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,
                         "Failed to get `translations` attribute in SkelAnimation: {}","");
              fmt::format<tinyusdz::Path>((string *)local_3e8,&local_3b8,abs_path);
            }
            else {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              operator=(&local_378,
                        (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        local_2f8);
              if (((long)local_378.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_378.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
                  ((long)local_398.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_398.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5) == 0) {
                if (local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar30 = 0;
                  uVar31 = 0;
                  do {
                    local_3e8 = SUB84(uVar31,0);
                    fStack_3e4 = (float)(uVar31 >> 0x20);
                    pmVar16 = ::std::
                              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_258,(key_type *)local_3e8);
                    pcVar32 = (pmVar16->_M_dataplus)._M_p;
                    local_1e8._0_8_ = local_1d8;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_1e8,pcVar32,pcVar32 + pmVar16->_M_string_length);
                    pmVar17 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&local_60,(key_type *)local_1e8);
                    local_3e8 = (undefined1  [4])0x1;
                    pmVar18 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar17,(key_type *)local_3e8);
                    puVar23 = (undefined8 *)
                              ((long)(local_378.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30)
                    ;
                    psVar2 = &(pmVar18->translations).static_value.contained;
                    if ((pmVar18->translations).static_value.has_value_ == true) {
                      *(undefined4 *)((long)&(pmVar18->translations).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar2 = *puVar23;
                    }
                    else {
                      uVar8 = *puVar23;
                      *(undefined4 *)((long)&(pmVar18->translations).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar2 = uVar8;
                      (pmVar18->translations).static_value.has_value_ = true;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1
                                     );
                    }
                    uVar31 = uVar31 + 1;
                    lVar30 = lVar30 + 0xc;
                    skelAnim = local_380;
                  } while (uVar31 < (ulong)((long)local_398.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_398.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                if (local_378.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_378.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_378.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_378.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_0034cff3;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15d0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,
                         "Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}"
                         ,"");
              local_358._M_dataplus._M_p =
                   (pointer)(((long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555);
              local_1f0 = (undefined1  [8])
                          ((long)local_398.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_398.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
              fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                        ((string *)local_3e8,(fmt *)&local_3b8,&local_358,(unsigned_long *)local_1f0
                         ,(unsigned_long *)abs_path,in_R9);
            }
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8),
                                 CONCAT44(fStack_3dc,fStack_3e0));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8),local_3d8._M_allocated_capacity + 1)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)&local_3c8->_err,CONCAT44(fStack_3e4,local_3e8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8),local_3d8._M_allocated_capacity + 1)
              ;
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
LAB_0034de31:
            if (local_378.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_378.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_0034c022;
          }
LAB_0034cff3:
          if ((bool)local_338[0x18] == true) {
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_358.field_2._M_allocated_capacity = 0;
            local_358._M_dataplus._M_p = (pointer)0x0;
            local_358._M_string_length = 0;
            if ((bool)local_338[0x19] == true) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15df);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              pcVar28 = "Failed to get `rotations` attribute in SkelAnimation: {}";
              pcVar24 = "";
LAB_0034d661:
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,pcVar28,pcVar24);
              fmt::format<tinyusdz::Path>((string *)local_3e8,&local_3b8,abs_path);
            }
            else {
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        &local_358,
                        (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        local_338);
              if ((long)(local_358._M_string_length - (long)local_358._M_dataplus._M_p) >> 4 ==
                  (long)local_398.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_398.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) {
                ::std::
                transform<__gnu_cxx::__normal_iterator<tinyusdz::value::quatf*,std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>,std::back_insert_iterator<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__0>
                          (local_358._M_dataplus._M_p,local_358._M_string_length,&local_378);
                if (local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar30 = 0;
                  uVar31 = 0;
                  do {
                    local_3e8 = SUB84(uVar31,0);
                    fStack_3e4 = (float)(uVar31 >> 0x20);
                    pmVar16 = ::std::
                              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_258,(key_type *)local_3e8);
                    pcVar32 = (pmVar16->_M_dataplus)._M_p;
                    local_1e8._0_8_ = local_1d8;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_1e8,pcVar32,pcVar32 + pmVar16->_M_string_length);
                    pmVar17 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&local_60,(key_type *)local_1e8);
                    local_3e8 = (undefined1  [4])0x2;
                    pmVar18 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar17,(key_type *)local_3e8);
                    puVar23 = (undefined8 *)
                              ((long)(local_378.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30)
                    ;
                    psVar5 = &(pmVar18->rotations).static_value.contained;
                    if ((pmVar18->rotations).static_value.has_value_ == true) {
                      uVar8 = puVar23[1];
                      *(undefined8 *)psVar5 = *puVar23;
                      *(undefined8 *)((long)&(pmVar18->rotations).static_value.contained + 8) =
                           uVar8;
                    }
                    else {
                      uVar8 = puVar23[1];
                      *(undefined8 *)psVar5 = *puVar23;
                      *(undefined8 *)((long)&(pmVar18->rotations).static_value.contained + 8) =
                           uVar8;
                      (pmVar18->rotations).static_value.has_value_ = true;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1
                                     );
                    }
                    uVar31 = uVar31 + 1;
                    lVar30 = lVar30 + 0x10;
                  } while (uVar31 < (ulong)((long)local_398.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_398.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                if (local_358._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity -
                                  (long)local_358._M_dataplus._M_p);
                }
                skelAnim = local_380;
                if (local_378.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_378.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_378.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_378.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_0034d570;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15e2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,
                         "Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}"
                         ,"");
              local_1f0 = (undefined1  [8])
                          ((long)(local_358._M_string_length - (long)local_358._M_dataplus._M_p) >>
                          4);
LAB_0034dd24:
              local_68 = (long)local_398.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_398.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
              fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                        ((string *)local_3e8,(fmt *)&local_3b8,(string *)local_1f0,&local_68,
                         (unsigned_long *)abs_path,in_R9);
            }
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8),
                                 CONCAT44(fStack_3dc,fStack_3e0));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8),local_3d8._M_allocated_capacity + 1)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)&local_3c8->_err,CONCAT44(fStack_3e4,local_3e8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(fStack_3e4,local_3e8),local_3d8._M_allocated_capacity + 1)
              ;
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
            if (local_358._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_358._M_dataplus._M_p,
                              local_358.field_2._M_allocated_capacity -
                              (long)local_358._M_dataplus._M_p);
            }
            goto LAB_0034de31;
          }
LAB_0034d570:
          bVar15 = true;
          if ((bool)local_2a8._M_local_buf[8] == true) {
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_378.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_358.field_2._M_allocated_capacity = 0;
            local_358._M_dataplus._M_p = (pointer)0x0;
            local_358._M_string_length = 0;
            if ((bool)local_2a8._M_local_buf[9] == true) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15fa);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              pcVar28 = "Failed to get `scales` attribute in SkelAnimation: {}";
              pcVar24 = "";
              goto LAB_0034d661;
            }
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&local_358,
                        (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)local_2b8);
            if (((long)(local_358._M_string_length - (long)local_358._M_dataplus._M_p) >> 1) *
                -0x5555555555555555 -
                ((long)local_398.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_398.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5) != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15fd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b8,
                         "Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}"
                         ,"");
              local_1f0 = (undefined1  [8])
                          (((long)(local_358._M_string_length - (long)local_358._M_dataplus._M_p) >>
                           1) * -0x5555555555555555);
              goto LAB_0034dd24;
            }
            ::std::
            transform<__gnu_cxx::__normal_iterator<std::array<tinyusdz::value::half,3ul>*,std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>,std::back_insert_iterator<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__1>
                      (local_358._M_dataplus._M_p,local_358._M_string_length,&local_378);
            if (local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_398.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar30 = 0;
              uVar27 = 0;
              do {
                StringAndIdMap::at_abi_cxx11_
                          ((string *)local_1e8,(StringAndIdMap *)local_258,uVar27);
                pmVar17 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                        *)&local_60,(string *)local_1e8);
                local_3e8 = (undefined1  [4])0x3;
                pmVar18 = ::std::
                          map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                          ::operator[](pmVar17,(key_type *)local_3e8);
                puVar23 = (undefined8 *)
                          ((long)(local_378.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30);
                psVar2 = &(pmVar18->scales).static_value.contained;
                if ((pmVar18->scales).static_value.has_value_ == true) {
                  *(undefined4 *)((long)&(pmVar18->scales).static_value.contained + 8) =
                       *(undefined4 *)(puVar23 + 1);
                  *(undefined8 *)psVar2 = *puVar23;
                }
                else {
                  uVar8 = *puVar23;
                  *(undefined4 *)((long)&(pmVar18->scales).static_value.contained + 8) =
                       *(undefined4 *)(puVar23 + 1);
                  *(undefined8 *)psVar2 = uVar8;
                  (pmVar18->scales).static_value.has_value_ = true;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._0_8_ != local_1d8) {
                  operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
                }
                uVar27 = uVar27 + 1;
                lVar30 = lVar30 + 0xc;
              } while (uVar27 < (ulong)((long)local_398.
                                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_398.
                                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            if (local_358._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_358._M_dataplus._M_p,
                              local_358.field_2._M_allocated_capacity -
                              (long)local_358._M_dataplus._M_p);
            }
            skelAnim = local_380;
            if (local_378.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_378.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_378.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
          poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x155e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b8,
                     "Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,"");
          fmt::format<tinyusdz::Path>((string *)local_3e8,&local_3b8,abs_path);
          poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,(char *)CONCAT44(fStack_3e4,local_3e8),
                               CONCAT44(fStack_3dc,fStack_3e0));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_3e4,local_3e8) != &local_3d8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_3e4,local_3e8),local_3d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
LAB_0034bfb2:
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
LAB_0034bfbf:
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,CONCAT44(fStack_3e4,local_3e8))
          ;
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_3e4,local_3e8);
          if (paVar29 != &local_3d8) {
LAB_0034bff4:
            operator_delete(paVar29,local_3d8._M_allocated_capacity + 1);
          }
LAB_0034c001:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          ::std::ios_base::~ios_base(local_178);
LAB_0034c022:
          bVar15 = false;
        }
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                   *)local_298);
        if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2b8._0_8_,
                          CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                   local_2a8._M_allocated_capacity._0_2_) - local_2b8._0_8_);
        }
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                   *)local_318);
        if ((pointer)local_338._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_338._0_8_,
                          CONCAT62(local_338._18_6_,local_338._16_2_) - local_338._0_8_);
        }
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   *)local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                                   local_2e8._M_allocated_capacity._0_2_) - local_2f8._0_8_);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)(local_238 + 0x10),(_Link_type)_Stack_220._M_parent);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_258,(_Link_type)CONCAT62(local_258._18_6_,local_258._16_2_));
        if (bVar15) goto LAB_0034c0cc;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
        poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1554);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
        local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,
                   "Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                   ,"");
        fmt::format<tinyusdz::Path>((string *)local_338,(string *)local_2b8,abs_path);
        poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,(char *)local_338._0_8_,
                             CONCAT62(local_338._10_6_,local_338._8_2_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
          operator_delete((void *)local_338._0_8_,CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
        }
        if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,
                          CONCAT62(local_2a8._M_allocated_capacity._2_6_,
                                   local_2a8._M_allocated_capacity._0_2_) + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&local_3c8->_err,local_338._0_8_);
        if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
          operator_delete((void *)local_338._0_8_,CONCAT62(local_338._18_6_,local_338._16_2_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        ::std::ios_base::~ios_base(local_178);
LAB_0034be4d:
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   *)local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_2f8._0_8_,
                          CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                                   local_2e8._M_allocated_capacity._0_2_) - local_2f8._0_8_);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)(local_238 + 0x10),(_Link_type)_Stack_220._M_parent);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_258,(_Link_type)CONCAT62(local_258._18_6_,local_258._16_2_));
      }
LAB_0034c79d:
      bVar15 = false;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  else {
    pSVar6 = env->stage;
    local_1e8._0_8_ = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"blendShapes","");
    psVar25 = &local_3c8->_err;
    bVar15 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                       (pSVar6,&skelAnim->blendShapes,(string *)local_1e8,&local_278,psVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    if (bVar15) {
      if ((((skelAnim->blendShapeWeights)._attrib.has_value_ != false) ||
          ((skelAnim->blendShapeWeights)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (skelAnim->blendShapeWeights)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((skelAnim->blendShapeWeights)._value_empty != false ||
          ((skelAnim->blendShapeWeights)._blocked != false)))) goto LAB_0034ad0c;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x153d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      pcVar28 = "`blendShapeWeights` must be authored for SkelAnimation Prim {}";
      pcVar24 = "";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1539);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      pcVar28 = "Failed to evaluate `blendShapes` in SkelAnimation Prim : {}";
      pcVar24 = "";
    }
    local_2f8._0_8_ = &local_2e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,pcVar28,pcVar24);
    fmt::format<tinyusdz::Path>((string *)local_258,(string *)local_2f8,abs_path);
    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,(char *)local_258._0_8_,
                         CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,
                      CONCAT62(local_2e8._M_allocated_capacity._2_6_,
                               local_2e8._M_allocated_capacity._0_2_) + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)psVar25,local_258._0_8_);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    ::std::ios_base::~ios_base(local_178);
    bVar15 = false;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_278);
LAB_0034c7bd:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_398);
  return bVar15;
}

Assistant:

bool RenderSceneConverter::ConvertSkelAnimation(const RenderSceneConverterEnv &env,
                                            const Path &abs_path,
                                            const SkelAnimation &skelAnim,
                                            Animation *anim_out) {
  // The spec says
  // """
  // An animation source is only valid if its translation, rotation, and scale components are all authored, storing arrays size to the same size as the authored joints array.
  // """
  //
  // SkelAnimation contains
  // - Joint animations(translation, rotation, scale)
  // - BlendShape animations(weights)

  std::vector<value::token> joints;

  if (skelAnim.joints.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.joints, "joints", &joints, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `joints` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.rotations.authored() ||
        !skelAnim.translations.authored() ||
        !skelAnim.scales.authored()) {

      PUSH_ERROR_AND_RETURN(fmt::format("`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}", abs_path, skelAnim.translations.authored() ? "yes" : "no",
      skelAnim.rotations.authored() ? "yes" : "no",
      skelAnim.scales.authored() ? "yes" : "no"));
    }
  }

  // TODO: inbetweens BlendShape
  std::vector<value::token> blendShapes;
  if (skelAnim.blendShapes.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.blendShapes, "blendShapes", &blendShapes, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `blendShapes` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.blendShapeWeights.authored()) {
      PUSH_ERROR_AND_RETURN(fmt::format("`blendShapeWeights` must be authored for SkelAnimation Prim {}", abs_path));
    }

  }


  //
  // Reorder values[channels][timeCode][jointId] into values[jointId][channels][timeCode]
  //

  std::map<std::string, std::map<AnimationChannel::ChannelType, AnimationChannel>> channelMap;

  // Joint animations
  if (joints.size()) {
    StringAndIdMap jointIdMap;

    for (const auto &joint : joints) {
      uint64_t id = jointIdMap.size();
      jointIdMap.add(joint.str(), id);
    }

    Animatable<std::vector<value::float3>> translations;
    if (!skelAnim.translations.get_value(&translations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::quatf>> rotations;
    if (!skelAnim.rotations.get_value(&rotations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::half3>> scales;
    if (!skelAnim.scales.get_value(&scales)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    DCOUT("translations: has_timesamples " << translations.has_timesamples());
    DCOUT("translations: has_default " << translations.has_default());
    DCOUT("rotations: has_timesamples " << rotations.has_timesamples());
    DCOUT("rotations: has_default " << rotations.has_default());
    DCOUT("scales: has_timesamples " << scales.has_timesamples());
    DCOUT("scales: has_default " << scales.has_default());

    //
    // timesamples value
    //

    if (translations.has_timesamples()) {
      DCOUT("Convert ttranslations");
      const TypedTimeSamples<std::vector<value::float3>> &ts_txs = translations.get_timesamples();

      if (ts_txs.get_samples().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`translations` timeSamples in SkelAnimation is empty : {}", abs_path));
      }

      for (const auto &sample : ts_txs.get_samples()) {
        if (!sample.blocked) {
          // length check
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value = sample.value[j];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
            if (it.translations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Translation;
            }
            it.translations.samples.push_back(s);
          }

        }
      }
    }

    if (rotations.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::quatf>> &ts_rots = rotations.get_timesamples();
      DCOUT("Convert rotations");
      for (const auto &sample : ts_rots.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }
          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float4> s;
            s.t = float(sample.t);
            s.value[0] = sample.value[j][0];
            s.value[1] = sample.value[j][1];
            s.value[2] = sample.value[j][2];
            s.value[3] = sample.value[j][3];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
            if (it.rotations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Rotation;
            }
            it.rotations.samples.push_back(s);
          }

        }
      }
    }

    if (scales.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::half3>> &ts_scales = scales.get_timesamples();
      DCOUT("Convert scales");
      for (const auto &sample : ts_scales.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value[0] = value::half_to_float(sample.value[j][0]);
            s.value[1] = value::half_to_float(sample.value[j][1]);
            s.value[2] = value::half_to_float(sample.value[j][2]);

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
            if (it.scales.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Scale;
            }
            it.scales.samples.push_back(s);
          }

        }
      }
    }

    //
    // value at 'default' time.
    //

    // Get value and also do length check for scalar(non timeSampled) animation value.
    if (translations.has_default()) {
      DCOUT("translation at default time");
      std::vector<value::float3> translation;
      if (!translations.get_scalar(&translation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute in SkelAnimation: {}", abs_path));
      }
      if (translation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}", translation.size(), joints.size(), abs_path));
      }

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
        it.translations.static_value = translation[j];
      }
    }

    if (rotations.has_default()) {
      DCOUT("rotations at default time");
      std::vector<value::float4> rotation;
      std::vector<value::quatf> _rotation;
      if (!rotations.get_scalar(&_rotation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute in SkelAnimation: {}", abs_path));
      }
      if (_rotation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}", _rotation.size(), joints.size(), abs_path));
      }
      std::transform(_rotation.begin(), _rotation.end(), std::back_inserter(rotation), [](const value::quatf &v) {
        value::float4 ret;
        // pxrUSD's TfQuat also uses xyzw memory order.
        ret[0] = v[0];
        ret[1] = v[1];
        ret[2] = v[2];
        ret[3] = v[3];
        return ret;
      });

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
        it.rotations.static_value = rotation[j];
      }
    }

    if (scales.has_default()) {
      DCOUT("scales at default time");
      std::vector<value::float3> scale;
      std::vector<value::half3> _scale;
      if (!scales.get_scalar(&_scale)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute in SkelAnimation: {}", abs_path));
      }
      if (_scale.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}", _scale.size(), joints.size(), abs_path));
      }
      // half -> float
      std::transform(_scale.begin(), _scale.end(), std::back_inserter(scale), [](const value::half3 &v) {
        value::float3 ret;
        ret[0] = value::half_to_float(v[0]);
        ret[1] = value::half_to_float(v[1]);
        ret[2] = value::half_to_float(v[2]);
        return ret;
      });
      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
        it.scales.static_value = scale[j];
      }
    }


#if 0 // TODO: remove
    if (!is_translations_timesamples) {
      DCOUT("Reorder translation samples");
      // Create a channel value with single-entry
      // Use USD TimeCode::Default for static sample.
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].type = AnimationChannel::ChannelType::Translation;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = translation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.push_back(s);
      }
    }

    if (!is_rotations_timesamples) {
      DCOUT("Reorder rotation samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].type = AnimationChannel::ChannelType::Rotation;

        AnimationSample<value::float4> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        DCOUT("rot joint_id " << joint_id);
        s.value = rotation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.push_back(s);
      }
    }

    if (!is_scales_timesamples) {
      DCOUT("Reorder scale samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].type = AnimationChannel::ChannelType::Scale;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = scale[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.push_back(s);
      }
    }
#endif
  }

  // BlendShape animations
  if (blendShapes.size()) {

    std::map<std::string, AnimationSampler<float>> weightsMap;

    // Blender 4.1 may export empty bendShapeWeights. We'll accept it.
    //
    // float[] blendShapeWeights
    if (skelAnim.blendShapeWeights.is_value_empty()) {
      for (const auto &bs : blendShapes) {
        weightsMap[bs.str()].static_value = 1.0f;
      }
    } else {

      Animatable<std::vector<float>> weights;
      if (!skelAnim.blendShapeWeights.get_value(&weights)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
      }

      if (weights.has_timesamples()) {

        const TypedTimeSamples<std::vector<float>> &ts_weights = weights.get_timesamples();
        DCOUT("Convert timeSampledd weights");
        for (const auto &sample : ts_weights.get_samples()) {
          if (!sample.blocked) {
            if (sample.value.size() != blendShapes.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", sample.t, sample.value.size(), blendShapes.size(), abs_path));
            }

            for (size_t j = 0; j < sample.value.size(); j++) {
              AnimationSample<float> s;
              s.t = float(sample.t);
              s.value = sample.value[j];

              const std::string &targetName = blendShapes[j].str();
              weightsMap[targetName].samples.push_back(s);
            }

          }
        }
      }

      if (weights.has_default()) {
        std::vector<float> ws;
        if (!weights.get_scalar(&ws)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
        }

        if (ws.size() != blendShapes.size()) {
          PUSH_ERROR_AND_RETURN(fmt::format("blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", ws.size(), blendShapes.size(), abs_path));
        }

        for (size_t i = 0; i < blendShapes.size(); i++) {
          weightsMap[blendShapes[i].str()].static_value = ws[i];
        }

      } else {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
      }

    }

    anim_out->blendshape_weights_map = std::move(weightsMap);
  }

  anim_out->abs_path = abs_path.full_path_name();
  anim_out->prim_name = skelAnim.name;
  anim_out->display_name = skelAnim.metas().displayName.value_or("");

  anim_out->channels_map = std::move(channelMap);

  return true;
}